

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::DoAddMember
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value,
          CrtAllocator *allocator)

{
  uint uVar1;
  Member *pMVar2;
  SizeType local_4c;
  Member *m;
  Member *members;
  ObjectData *o;
  CrtAllocator *allocator_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *value_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *name_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  if ((this->data_).s.hashcode <= (this->data_).s.length) {
    if ((this->data_).s.hashcode == 0) {
      local_4c = 0x10;
    }
    else {
      local_4c = (this->data_).s.hashcode + ((this->data_).s.hashcode + 1 >> 1);
    }
    DoReserveMembers(this,local_4c,allocator);
  }
  pMVar2 = GetMembersPointer(this);
  uVar1 = (this->data_).s.length;
  RawAssign(&pMVar2[uVar1].name,name);
  RawAssign(&pMVar2[uVar1].value,value);
  (this->data_).s.length = (this->data_).s.length + 1;
  return;
}

Assistant:

void DoAddMember(GenericValue& name, GenericValue& value, Allocator& allocator) {
        ObjectData& o = data_.o;
        if (o.size >= o.capacity)
            DoReserveMembers(o.capacity ? (o.capacity + (o.capacity + 1) / 2) : kDefaultObjectCapacity, allocator);
        Member* members = GetMembersPointer();
        Member* m = members + o.size;
        m->name.RawAssign(name);
        m->value.RawAssign(value);
#if RAPIDJSON_USE_MEMBERSMAP
        Map* &map = GetMap(members);
        MapIterator* mit = GetMapIterators(map);
        new (&mit[o.size]) MapIterator(map->insert(MapPair(m->name.data_, o.size)));
#endif
        ++o.size;
    }